

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M1Q<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  Scalar SVar1;
  size_type sVar2;
  ostream *this;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pMVar7;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> PVar13;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> PVar14;
  XprTypeNested local_fe0;
  XprTypeNested local_fd8;
  XprTypeNested local_fd0;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>
  local_fc8;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>
  local_fb8;
  Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_fa0;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_f80;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_f58;
  undefined1 local_f28 [8];
  Matrix<float,_4,_4,_0,_4,_4> estTrans;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_eab [3];
  Matrix<float,4,4,0,4,4> local_ea8 [8];
  Matrix<float,_4,_4,_0,_4,_4> TV2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_e2b [3];
  Matrix<float,4,4,0,4,4> local_e28 [8];
  Matrix<float,_4,_4,_0,_4,_4> TV1;
  Scalar local_de0;
  Scalar local_ddc;
  Scalar local_dd8;
  Scalar local_dd4;
  Scalar local_dd0;
  Scalar local_dcc;
  Scalar local_dc8;
  Scalar local_dc4;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_dc0;
  Scalar local_d9c;
  Scalar local_d98;
  Scalar local_d94;
  Scalar local_d90;
  Scalar local_d8c;
  Scalar local_d88;
  Scalar local_d84;
  Scalar local_d80;
  Scalar local_d7c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_d78;
  undefined1 local_d58 [8];
  Matrix<float,_3,_3,_0,_3,_3> V2;
  Matrix<float,_3,_3,_0,_3,_3> V1;
  float alpha2;
  float alpha1;
  RhsNested local_d00;
  Matrix<float,4,1,0,4,1> local_cf8 [8];
  Matrix<float,_4,_1,_0,_4,_1> pv2;
  Matrix<float,4,1,0,4,1> local_cd8 [8];
  Matrix<float,_4,_1,_0,_4,_1> pv1;
  Type local_cc0;
  Type local_c88;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_c4b [3];
  Matrix<float,4,4,0,4,4> local_c48 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tv2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_bfb [3];
  Matrix<float,4,4,0,4,4> local_bf8 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tv1;
  Type local_b80;
  Type local_b48;
  TransposeReturnType local_b10;
  NegativeReturnType local_ad8;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>,_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
  local_a98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_6,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
  local_a20;
  Matrix<float,3,1,0,3,1> local_9c4 [8];
  Matrix<float,_3,_1,_0,_3,_1> v2;
  Type local_980;
  Type local_948;
  TransposeReturnType local_910;
  NegativeReturnType local_8d8;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>,_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
  local_898;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_6,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
  local_820;
  Matrix<float,3,1,0,3,1> local_7c4 [8];
  Matrix<float,_3,_1,_0,_3,_1> v1;
  Matrix<float,6,1,0,6,1> local_7a8 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU2;
  Matrix<float,6,1,0,6,1> local_780 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU1;
  Matrix<float,4,1,0,4,1> local_758 [8];
  Matrix<float,_4,_1,_0,_4,_1> pU2;
  Matrix<float,4,1,0,4,1> local_738 [8];
  Matrix<float,_4,_1,_0,_4,_1> pU1;
  Type local_720;
  Type local_6e8;
  Type local_6b0;
  Matrix<float,_3,_1,_0,_3,_1> local_674;
  Matrix<float,_3,_3,_0,_3,_3> local_668;
  int local_644;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_640;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_620;
  Type local_5c8;
  Type local_590;
  Type local_558;
  Type local_520;
  Type local_4e8;
  Type local_4b0;
  Type local_478;
  Matrix<float,_3,_1,_0,_3,_1> local_43c;
  Matrix<float,_3,_3,_0,_3,_3> local_430;
  int local_40c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_408;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_3e8;
  Type local_390;
  Type local_358;
  Type local_320;
  Type local_2e8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_2ab [3];
  Matrix<float,6,6,0,6,6> local_2a8 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_20b [3];
  Matrix<float,6,6,0,6,6> local_208 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_6,_1,_0,_6,_1> local_f0;
  Matrix<float,_6,_1,_0,_6,_1> local_d8;
  undefined1 local_c0 [8];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  trans;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_98;
  undefined1 local_50 [8];
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar2 = std::
          vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
          ::size(ptPair);
  if (sVar2 != 0) {
    sVar2 = std::
            vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
            ::size(lCPair);
    if (sVar2 != 0) {
      lines1.
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::vector(__return_storage_ptr__);
      pvVar3 = std::
               vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
               ::operator[](lCPair,0);
      std::
      pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::pair(&local_98,pvVar3);
      getPluckerCoord<float>
                ((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                  *)local_50,&local_98);
      pvVar4 = std::
               vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                             *)local_50,0);
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix(&local_d8,pvVar4);
      pvVar4 = std::
               vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                             *)local_50,1);
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix(&local_f0,pvVar4);
      getPredefinedTransformations1M1Q<float>
                ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *)local_c0,&local_d8,&local_f0);
      pvVar5 = std::
               vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                             *)local_c0,0);
      Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<float,_4,_4,_0,_4,_4> *)
                 (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),pvVar5);
      pvVar5 = std::
               vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                             *)local_c0,1);
      Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<float,_4,_4,_0,_4,_4> *)
                 (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + 0x22),pvVar5);
      Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
      Eigen::Matrix<float,6,6,0,6,6>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
                (local_208,local_20b);
      Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
      Eigen::Matrix<float,6,6,0,6,6>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
                (local_2a8,local_2ab);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_2e8,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_320,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_208,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_320,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_2e8);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_358,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
                (&local_390,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_208,3,3,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_390,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_358);
      local_40c = -1;
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
                (&local_478,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,1);
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
                ((Matrix<float,3,1,0,3,1> *)&local_43c,
                 (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_478);
      getSkew<float>(&local_430,&local_43c);
      Eigen::operator*(&local_408,&local_40c,(StorageBaseType *)&local_430);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_4b0,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
      ::operator*(&local_3e8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                   *)&local_408,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_4b0);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
                (&local_4e8,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_208,3,0,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_4e8,
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_3e8);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_520,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + 0x22),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_558,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2a8,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_558,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_520);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_590,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + 0x22),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
                (&local_5c8,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2a8,3,3,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_5c8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_590);
      local_644 = -1;
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
                (&local_6b0,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + 0x22),3,1);
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
                ((Matrix<float,3,1,0,3,1> *)&local_674,
                 (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_6b0);
      getSkew<float>(&local_668,&local_674);
      Eigen::operator*(&local_640,&local_644,(StorageBaseType *)&local_668);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_6e8,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + 0x22),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
      ::operator*(&local_620,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                   *)&local_640,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_6e8);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
                (&local_720,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2a8,3,0,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_720,
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_620);
      pvVar6 = std::
               vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
               ::operator[](ptPair,0);
      PVar13 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                         ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                          (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                           .m_data.array + 0xe),
                          (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar6);
      pU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
           PVar13.m_lhs;
      Eigen::Matrix<float,4,1,0,4,1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,1,0,4,1>,0>>
                (local_738,
                 (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                  *)(pU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                     m_data.array + 2));
      pvVar6 = std::
               vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
               ::operator[](ptPair,0);
      PVar13 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                         ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                          (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                           m_storage.m_data.array + 0x22),
                          (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar6->second);
      lU1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_
           = PVar13.m_lhs;
      Eigen::Matrix<float,4,1,0,4,1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,1,0,4,1>,0>>
                (local_758,
                 (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                  *)(lU1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 4));
      pMVar7 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
               std::
               vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                             *)local_50,0);
      PVar14 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_208,pMVar7);
      lU2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_
           = PVar14.m_lhs;
      Eigen::Matrix<float,6,1,0,6,1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
                (local_780,
                 (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)(lU2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 4));
      pMVar7 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
               std::
               vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                             *)local_50,1);
      PVar14 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2a8,pMVar7);
      v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ =
           PVar14.m_lhs;
      Eigen::Matrix<float,6,1,0,6,1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
                (local_7a8,
                 (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)(v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_948,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_738,3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::transpose
                (&local_910,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                 &local_948);
      Eigen::
      DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>_>
      ::operator-(&local_8d8,
                  (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                   *)&local_910);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_980,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_780,3);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>const>>
      ::operator*(&local_898,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>const>>
                   *)&local_8d8,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &local_980);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(v2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                 (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_780,3);
      Eigen::operator*(&local_820,&local_898,
                       (StorageBaseType *)
                       (v2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,6,1>const>const,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                (local_7c4,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_6,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                  *)&local_820);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_b48,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_758,3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::transpose
                (&local_b10,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                 &local_b48);
      Eigen::
      DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>_>
      ::operator-(&local_ad8,
                  (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                   *)&local_b10);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_b80,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_7a8,3);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>const>>
      ::operator*(&local_a98,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>const>>
                   *)&local_ad8,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                  &local_b80);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(Tv1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xe),
                 (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_7a8,3);
      Eigen::operator*(&local_a20,&local_a98,
                       (StorageBaseType *)
                       (Tv1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xe));
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,6,1>const>const,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                (local_9c4,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_6,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                  *)&local_a20);
      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
      Eigen::Matrix<float,4,4,0,4,4>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                (local_bf8,local_bfb);
      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
      Eigen::Matrix<float,4,4,0,4,4>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                (local_c48,local_c4b);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
                (&local_c88,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_bf8,3,1);
      Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_c88,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_7c4);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
                (&local_cc0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_c48,3,1);
      Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_cc0,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9c4);
      PVar13 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                         ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_bf8,
                          (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_738);
      pv2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
           PVar13.m_lhs;
      Eigen::Matrix<float,4,1,0,4,1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,1,0,4,1>,0>>
                (local_cd8,
                 (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                  *)(pv2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                     m_data.array + 2));
      _alpha2 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                          ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_c48,
                           (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_758);
      Eigen::Matrix<float,4,1,0,4,1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,1,0,4,1>,0>>
                (local_cf8,
                 (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                  *)&alpha2);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_cd8,1);
      SVar1 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_cd8,0);
      dVar10 = std::atan2((double)(ulong)(uint)SVar1,(double)(ulong)(uint)*pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_cf8,1);
      SVar1 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_cf8,0);
      dVar11 = std::atan2((double)(ulong)(uint)SVar1,(double)(ulong)(uint)*pSVar8);
      Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
                ((Matrix<float,_3,_3,_0,_3,_3> *)
                 (V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 7));
      Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_d58);
      dVar12 = std::cos((double)((ulong)dVar10 & 0xffffffff));
      local_d7c = SUB84(dVar12,0);
      Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
                (&local_d78,
                 (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                 (V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 7),&local_d7c);
      dVar12 = std::sin((double)((ulong)dVar10 & 0xffffffff));
      local_d80 = SUB84(dVar12,0);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (&local_d78,&local_d80);
      local_d84 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_d84);
      dVar12 = std::sin((double)((ulong)dVar10 & 0xffffffff));
      local_d88 = -SUB84(dVar12,0);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_d88);
      dVar10 = std::cos((double)((ulong)dVar10 & 0xffffffff));
      local_d8c = SUB84(dVar10,0);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_d8c);
      local_d90 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_d90);
      local_d94 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_d94);
      local_d98 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_d98);
      local_d9c = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar9,&local_d9c);
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_d78);
      dVar10 = std::cos((double)((ulong)dVar11 & 0xffffffff));
      local_dc4 = SUB84(dVar10,0);
      Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
                (&local_dc0,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_d58,&local_dc4)
      ;
      dVar10 = std::sin((double)((ulong)dVar11 & 0xffffffff));
      local_dc8 = SUB84(dVar10,0);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (&local_dc0,&local_dc8);
      local_dcc = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_dcc);
      dVar10 = std::sin((double)((ulong)dVar11 & 0xffffffff));
      local_dd0 = -SUB84(dVar10,0);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_dd0);
      dVar10 = std::cos((double)((ulong)dVar11 & 0xffffffff));
      local_dd4 = SUB84(dVar10,0);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_dd4);
      local_dd8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_dd8);
      local_ddc = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_ddc);
      local_de0 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar9,&local_de0);
      TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
           1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                (pCVar9,TV1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xf);
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_dc0);
      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
      Eigen::Matrix<float,4,4,0,4,4>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                (local_e28,local_e2b);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                ((Type *)(TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xe),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_e28
                 ,3,3);
      Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
                 (TV2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),
                 (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                 (V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 7));
      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
      Eigen::Matrix<float,4,4,0,4,4>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                (local_ea8,local_eab);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                ((Type *)(estTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe),
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_ea8,3,3);
      Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
                 (estTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 0xe),(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_d58);
      local_fd0 = (XprTypeNested)
                  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                              m_storage.m_data.array + 0x22));
      local_fd8 = (XprTypeNested)
                  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_c48);
      local_fc8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                            ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)
                             &local_fd0,
                             (MatrixBase<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                             &local_fd8);
      local_fe0 = (XprTypeNested)
                  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_ea8);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
      ::operator*(&local_fb8,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
                   *)&local_fc8,
                  (MatrixBase<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)&local_fe0);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
      ::operator*(&local_fa0,
                  (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
                   *)&local_fb8,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_e28);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
      ::operator*(&local_f80,
                  (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                   *)&local_fa0,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_bf8);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
      ::operator*(&local_f58,
                  (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                   *)&local_f80,
                  (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                  (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0xe));
      Eigen::Matrix<float,4,4,0,4,4>::
      Matrix<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                ((Matrix<float,4,4,0,4,4> *)local_f28,
                 (EigenBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                  *)&local_f58);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_f28);
      lines1.
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::~vector((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 *)local_c0);
      std::
      vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 *)local_50);
      if ((lines1.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  }
  this = std::operator<<((ostream *)&std::cerr,
                         "Solver 1M1Q requires at least 1 point, and 1 line correspondence!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1Q(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(ptPair.size() < 1 || lCPair.size() < 1){
		std::cerr << "Solver 1M1Q requires at least 1 point, and 1 line correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -1*getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -1*getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,4,1> pU1 = TU1*ptPair[0].first;
	Eigen::Matrix<floatPrec,4,1> pU2 = TU2*ptPair[0].second;
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];

	// move origin to point projection to line
	Eigen::Matrix<floatPrec,3,1> v1 = -pU1.head(3).transpose()*lU1.head(3)*lU1.head(3);
	Eigen::Matrix<floatPrec,3,1> v2 = -pU2.head(3).transpose()*lU2.head(3)*lU2.head(3);
	Eigen::Matrix<floatPrec,4,4> Tv1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tv2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tv1.topRightCorner(3,1) = v1; Tv2.topRightCorner(3,1) = v2;

	// transform to new frame
	Eigen::Matrix<floatPrec,4,1> pv1 = Tv1*pU1;
	Eigen::Matrix<floatPrec,4,1> pv2 = Tv2*pU2;

	// align P to x axis
	floatPrec alpha1 = atan2(pv1(1),pv1(0));
	floatPrec alpha2 = atan2(pv2(1),pv2(0));
	Eigen::Matrix<floatPrec,3,3> V1, V2;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> estTrans = TU2.inverse()*Tv2.inverse()*TV2.inverse()*TV1*Tv1*TU1;
	// std::cout << estTrans << std::endl;
	out.push_back(estTrans);

	return out;
}